

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void wasm::
     CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
     ::doEndBlock(CFGBuilder *self,Expression **currp)

{
  BasicBlock *__from;
  bool bVar1;
  pointer ppVar2;
  vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
  *this;
  size_type sVar3;
  reference ppBVar4;
  BasicBlock *origin;
  iterator __end0;
  iterator __begin0;
  vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
  *__range2;
  BasicBlock *last;
  vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
  *origins;
  _Self local_28;
  iterator iter;
  Block *curr;
  Expression **currp_local;
  CFGBuilder *self_local;
  
  iter._M_node = (_Base_ptr)Expression::cast<wasm::Block>(*currp);
  bVar1 = IString::is(&(((Block *)iter._M_node)->name).super_IString);
  if (bVar1) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>_>_>
         ::find(&(self->
                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                 ).branches,(key_type *)&(iter._M_node)->_M_left);
    origins = (vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
               *)std::
                 map<wasm::Name,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>_>_>
                 ::end(&(self->
                        super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                        ).branches);
    bVar1 = std::operator==(&local_28,(_Self *)&origins);
    if (!bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>_>
               ::operator->(&local_28);
      this = &ppVar2->second;
      sVar3 = std::
              vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
              ::size(this);
      if (sVar3 != 0) {
        __from = (self->
                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                 ).currBasicBlock;
        startBasicBlock(&self->
                         super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                       );
        link(&self->
              super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             ,(char *)__from,
             (char *)(self->
                     super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                     ).currBasicBlock);
        __end0 = std::
                 vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
                 ::begin(this);
        origin = (BasicBlock *)
                 std::
                 vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
                 ::end(this);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end0,(__normal_iterator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_**,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>
                                           *)&origin), bVar1) {
          ppBVar4 = __gnu_cxx::
                    __normal_iterator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_**,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>
                    ::operator*(&__end0);
          link(&self->
                super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
               ,(char *)*ppBVar4,
               (char *)(self->
                       super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                       ).currBasicBlock);
          __gnu_cxx::
          __normal_iterator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_**,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>
          ::operator++(&__end0);
        }
        std::
        map<wasm::Name,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>_>_>
        ::erase(&(self->
                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                 ).branches,(key_type *)&(iter._M_node)->_M_left);
      }
    }
  }
  return;
}

Assistant:

static void doEndBlock(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<Block>();
    if (!curr->name.is()) {
      return;
    }
    auto iter = self->branches.find(curr->name);
    if (iter == self->branches.end()) {
      return;
    }
    auto& origins = iter->second;
    if (origins.size() == 0) {
      return;
    }
    // we have branches to here, so we need a new block
    auto* last = self->currBasicBlock;
    self->startBasicBlock();
    self->link(last, self->currBasicBlock); // fallthrough
    // branches to the new one
    for (auto* origin : origins) {
      self->link(origin, self->currBasicBlock);
    }
    self->branches.erase(curr->name);
  }